

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O0

void __thiscall
Catch::IStreamingReporter::listReporters
          (IStreamingReporter *this,
          vector<Catch::ReporterDescription,_std::allocator<Catch::ReporterDescription>_>
          *descriptions,IConfig *config)

{
  IConfig *this_00;
  bool bVar1;
  int iVar2;
  ostream *poVar3;
  const_iterator cVar4;
  const_iterator cVar5;
  pointer this_01;
  Column *pCVar6;
  Column *pCVar7;
  Column local_158;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_120;
  Column local_100;
  Columns local_c8;
  Column local_a0;
  reference local_68;
  ReporterDescription *desc;
  const_iterator __end1;
  const_iterator __begin1;
  vector<Catch::ReporterDescription,_std::allocator<Catch::ReporterDescription>_> *__range1;
  __normal_iterator<const_Catch::ReporterDescription_*,_std::vector<Catch::ReporterDescription,_std::allocator<Catch::ReporterDescription>_>_>
  local_30;
  size_type local_28;
  size_type maxNameLen;
  IConfig *config_local;
  vector<Catch::ReporterDescription,_std::allocator<Catch::ReporterDescription>_>
  *descriptions_local;
  IStreamingReporter *this_local;
  
  maxNameLen = (size_type)config;
  config_local = (IConfig *)descriptions;
  descriptions_local =
       (vector<Catch::ReporterDescription,_std::allocator<Catch::ReporterDescription>_> *)this;
  poVar3 = cout();
  std::operator<<(poVar3,"Available reporters:\n");
  cVar4 = std::vector<Catch::ReporterDescription,_std::allocator<Catch::ReporterDescription>_>::
          begin((vector<Catch::ReporterDescription,_std::allocator<Catch::ReporterDescription>_> *)
                config_local);
  cVar5 = std::vector<Catch::ReporterDescription,_std::allocator<Catch::ReporterDescription>_>::end
                    ((vector<Catch::ReporterDescription,_std::allocator<Catch::ReporterDescription>_>
                      *)config_local);
  local_30 = std::
             max_element<__gnu_cxx::__normal_iterator<Catch::ReporterDescription_const*,std::vector<Catch::ReporterDescription,std::allocator<Catch::ReporterDescription>>>,Catch::IStreamingReporter::listReporters(std::vector<Catch::ReporterDescription,std::allocator<Catch::ReporterDescription>>const&,Catch::IConfig_const&)::__0>
                       (cVar4._M_current,cVar5._M_current);
  this_01 = __gnu_cxx::
            __normal_iterator<const_Catch::ReporterDescription_*,_std::vector<Catch::ReporterDescription,_std::allocator<Catch::ReporterDescription>_>_>
            ::operator->(&local_30);
  local_28 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
                       (&this_01->name);
  this_00 = config_local;
  __end1 = std::vector<Catch::ReporterDescription,_std::allocator<Catch::ReporterDescription>_>::
           begin((vector<Catch::ReporterDescription,_std::allocator<Catch::ReporterDescription>_> *)
                 config_local);
  desc = (ReporterDescription *)
         std::vector<Catch::ReporterDescription,_std::allocator<Catch::ReporterDescription>_>::end
                   ((vector<Catch::ReporterDescription,_std::allocator<Catch::ReporterDescription>_>
                     *)this_00);
  while( true ) {
    bVar1 = __gnu_cxx::
            operator==<const_Catch::ReporterDescription_*,_std::vector<Catch::ReporterDescription,_std::allocator<Catch::ReporterDescription>_>_>
                      (&__end1,(__normal_iterator<const_Catch::ReporterDescription_*,_std::vector<Catch::ReporterDescription,_std::allocator<Catch::ReporterDescription>_>_>
                                *)&desc);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    local_68 = __gnu_cxx::
               __normal_iterator<const_Catch::ReporterDescription_*,_std::vector<Catch::ReporterDescription,_std::allocator<Catch::ReporterDescription>_>_>
               ::operator*(&__end1);
    iVar2 = (**(code **)(*(long *)maxNameLen + 0xa0))();
    if (iVar2 == 0) {
      poVar3 = cout();
      TextFlow::Column::Column(&local_a0,&local_68->name);
      pCVar6 = TextFlow::Column::indent(&local_a0,2);
      pCVar6 = TextFlow::Column::width(pCVar6,local_28 + 5);
      poVar3 = TextFlow::operator<<(poVar3,pCVar6);
      std::operator<<(poVar3,'\n');
      TextFlow::Column::~Column(&local_a0);
    }
    else {
      poVar3 = cout();
      std::operator+(&local_120,&local_68->name,":");
      TextFlow::Column::Column(&local_100,&local_120);
      pCVar6 = TextFlow::Column::indent(&local_100,2);
      pCVar6 = TextFlow::Column::width(pCVar6,local_28 + 5);
      TextFlow::Column::Column(&local_158,&local_68->description);
      pCVar7 = TextFlow::Column::initialIndent(&local_158,0);
      pCVar7 = TextFlow::Column::indent(pCVar7,2);
      pCVar7 = TextFlow::Column::width(pCVar7,0x48 - local_28);
      TextFlow::Column::operator+(&local_c8,pCVar6,pCVar7);
      poVar3 = TextFlow::operator<<(poVar3,&local_c8);
      std::operator<<(poVar3,'\n');
      TextFlow::Columns::~Columns(&local_c8);
      TextFlow::Column::~Column(&local_158);
      TextFlow::Column::~Column(&local_100);
      std::__cxx11::string::~string((string *)&local_120);
    }
    __gnu_cxx::
    __normal_iterator<const_Catch::ReporterDescription_*,_std::vector<Catch::ReporterDescription,_std::allocator<Catch::ReporterDescription>_>_>
    ::operator++(&__end1);
  }
  poVar3 = cout();
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void IStreamingReporter::listReporters(std::vector<ReporterDescription> const &descriptions, IConfig const &config) {
        Catch::cout() << "Available reporters:\n";
        const auto maxNameLen = std::max_element(descriptions.begin(), descriptions.end(),
            [](ReporterDescription const &lhs, ReporterDescription const &rhs) { return lhs.name.size() < rhs.name.size(); })
            ->name.size();

        for (auto const &desc : descriptions) {
            if (config.verbosity() == Verbosity::Quiet) {
                Catch::cout()
                    << TextFlow::Column(desc.name)
                    .indent(2)
                    .width(5 + maxNameLen) << '\n';
            }
            else {
                Catch::cout()
                    << TextFlow::Column(desc.name + ":")
                    .indent(2)
                    .width(5 + maxNameLen)
                    + TextFlow::Column(desc.description)
                    .initialIndent(0)
                    .indent(2)
                    .width(CATCH_CONFIG_CONSOLE_WIDTH - maxNameLen - 8)
                    << '\n';
            }
        }
        Catch::cout() << std::endl;
    }